

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMDG2Dot.h
# Opt level: O0

bool __thiscall dg::debug::LLVMDG2Dot::checkNode(LLVMDG2Dot *this,ostream *os,LLVMNode *node)

{
  bool bVar1;
  Value *pVVar2;
  BBlock<dg::LLVMNode> *pBVar3;
  ret_type this_00;
  raw_ostream *prVar4;
  Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> *in_RDX;
  ostream *in_RSI;
  raw_os_ostream ross;
  DebugLoc *Loc;
  Instruction *I;
  Value *val;
  bool err;
  ostream *in_stack_ffffffffffffff78;
  raw_ostream *in_stack_ffffffffffffff80;
  bool local_1;
  
  local_1 = false;
  pVVar2 = Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::getKey(in_RDX);
  if (pVVar2 == (Value *)0x0) {
    std::operator<<(in_RSI,"\\nERR: no value in node");
    local_1 = true;
  }
  else {
    pBVar3 = Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::getBBlock(in_RDX);
    if (((pBVar3 == (BBlock<dg::LLVMNode> *)0x0) &&
        (bVar1 = llvm::isa<llvm::Function,llvm::Value_const*>((Value **)0x1cd06a), !bVar1)) &&
       (bVar1 = llvm::isa<llvm::GlobalVariable,llvm::Value_const*>((Value **)0x1cd078), !bVar1)) {
      local_1 = true;
      std::operator<<(in_RSI,"\\nERR: no BB");
    }
    this_00 = llvm::dyn_cast<llvm::Instruction,llvm::Value_const>
                        ((Value *)in_stack_ffffffffffffff80);
    if (this_00 != (ret_type)0x0) {
      prVar4 = (raw_ostream *)llvm::Instruction::getDebugLoc(this_00);
      bVar1 = llvm::DebugLoc::operator_cast_to_bool((DebugLoc *)0x1cd0c2);
      if (bVar1) {
        std::operator<<(in_RSI,"\" labelURL=\"");
        llvm::raw_os_ostream::raw_os_ostream
                  ((raw_os_ostream *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
        llvm::DebugLoc::print(prVar4);
        llvm::raw_ostream::flush(in_stack_ffffffffffffff80);
        llvm::raw_os_ostream::~raw_os_ostream((raw_os_ostream *)&stack0xffffffffffffff78);
      }
    }
  }
  return local_1;
}

Assistant:

bool checkNode(std::ostream &os, LLVMNode *node) override {
        bool err = false;
        const llvm::Value *val = node->getKey();

        if (!val) {
            os << "\\nERR: no value in node";
            return true;
        }

        if (!node->getBBlock() && !llvm::isa<llvm::Function>(val) &&
            !llvm::isa<llvm::GlobalVariable>(val)) {
            err = true;
            os << "\\nERR: no BB";
        }

        // Print Location in source file. Print it only for LLVM 3.6 and higher.
        // The versions before 3.6 had different API, so this is quite
        // a workaround, not a real fix. If anybody needs this functionality
        // on those versions, fix this :)
        if (const llvm::Instruction *I =
                    llvm::dyn_cast<llvm::Instruction>(val)) {
            const llvm::DebugLoc &Loc = I->getDebugLoc();
#if ((LLVM_VERSION_MAJOR > 3) ||                                               \
     ((LLVM_VERSION_MAJOR == 3) && (LLVM_VERSION_MINOR > 6)))
            if (Loc) {
                os << "\" labelURL=\"";
                llvm::raw_os_ostream ross(os);
                Loc.print(ross);
#else
            if (Loc.getLine() > 0) {
                os << "\" labelURL=\"";
                llvm::raw_os_ostream ross(os);
                // Loc.print(I->getParent()->getContext(), ross);
                const llvm::DebugLoc *tmpLoc = &Loc;
                int nclosingBrack = 0;
                while (tmpLoc) {
                    llvm::DIScope Scope(
                            tmpLoc->getScope(I->getParent()->getContext()));
                    ross << Scope.getFilename();
                    ross << ':' << tmpLoc->getLine();
                    if (tmpLoc->getCol() != 0)
                        ross << ':' << tmpLoc->getCol();

                    llvm::MDNode *inlineMN =
                            tmpLoc->getInlinedAt(I->getParent()->getContext());
                    if (inlineMN) {
                        llvm::DebugLoc InlinedAtDL =
                                llvm::DebugLoc::getFromDILocation(inlineMN);
                        if (!InlinedAtDL.isUnknown()) {
                            ross << " @[ ";
                            tmpLoc = &InlinedAtDL;
                            nclosingBrack++;
                        } else {
                            tmpLoc = nullptr;
                        }
                    } else {
                        tmpLoc = nullptr;
                    }
                }
                while (nclosingBrack > 0) {
                    ross << " ]";
                    nclosingBrack--;
                }
#endif
                ross.flush();
            }
        }

        return err;
    }

    bool dump(const char *new_file = nullptr,
              const char *dump_func_only = nullptr) override {
        // make sure we have the file opened
        if (!ensureFile(new_file))
            return false;

        const std::map<llvm::Value *, LLVMDependenceGraph *> &CF =
                getConstructedFunctions();

        start();

        for (const auto &F : CF) {
            if (dump_func_only && !F.first->getName().equals(dump_func_only))
                continue;

            dumpSubgraph(F.second, F.first->getName().data());
        }

        end();

        return true;
    }

  private:
    void dumpSubgraph(LLVMDependenceGraph *graph, const char *name) {
        dumpSubgraphStart(graph, name);

        for (auto &B : graph->getBlocks()) {
            dumpBBlock(B.second);
        }

        for (auto &B : graph->getBlocks()) {
            dumpBBlockEdges(B.second);
        }

        dumpSubgraphEnd(graph);
    }
}